

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabItem *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  char *text;
  bool *pbVar8;
  ulong uVar9;
  ImS8 IVar10;
  ImU32 id;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar11;
  ImGuiTabItem *pIVar12;
  size_t sVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  ImGuiTabItemFlags flags_00;
  int iVar17;
  ImGuiCol idx;
  ulong uVar18;
  undefined7 uVar20;
  undefined8 uVar19;
  ImGuiTabItem *pIVar21;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar26;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  undefined8 local_88;
  ImGuiTabItem *local_80;
  uint local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  int local_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  char *local_40;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    uVar19 = 0;
    goto LAB_00213356;
  }
  local_38 = (bool *)0x0;
  uVar15 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar15 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar15 = flags;
  }
  IVar6 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  fVar24 = IVar6.x;
  if (id == 0) {
LAB_002130f7:
    p_open = (bool *)0x0;
  }
  else {
    uVar11 = (ulong)(tab_bar->Tabs).Size;
    bVar23 = 0 < (long)uVar11;
    if (0 < (long)uVar11) {
      p_open = (bool *)(tab_bar->Tabs).Data;
      bVar23 = true;
      if (((ImGuiTabItem *)p_open)->ID != id) {
        pIVar12 = (ImGuiTabItem *)((long)p_open + (uVar11 - 1) * 0x20);
        uVar9 = 1;
        pIVar21 = (ImGuiTabItem *)p_open;
        do {
          uVar18 = uVar9;
          p_open = (bool *)pIVar12;
          if (uVar11 == uVar18) break;
          p_open = (bool *)(pIVar21 + 1);
          pIVar1 = pIVar21 + 1;
          uVar9 = uVar18 + 1;
          pIVar21 = (ImGuiTabItem *)p_open;
        } while (pIVar1->ID != id);
        bVar23 = uVar18 < uVar11;
      }
    }
    if (!bVar23) goto LAB_002130f7;
  }
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_4_ = IVar6.x;
  local_58._4_4_ = IVar6.y;
  local_58._12_4_ = extraout_XMM0_Dd;
  local_80 = (ImGuiTabItem *)p_open;
  if ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0) {
    iVar17 = (tab_bar->Tabs).Size;
    iVar3 = (tab_bar->Tabs).Capacity;
    if (iVar17 == iVar3) {
      iVar17 = iVar17 + 1;
      if (iVar3 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar3 / 2 + iVar3;
      }
      if (iVar17 < iVar16) {
        iVar17 = iVar16;
      }
      if (iVar3 < iVar17) {
        pIVar12 = (ImGuiTabItem *)MemAlloc((long)iVar17 << 5);
        pIVar21 = (tab_bar->Tabs).Data;
        if (pIVar21 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar12,pIVar21,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar12;
        (tab_bar->Tabs).Capacity = iVar17;
        fVar24 = (float)local_58._0_4_;
      }
    }
    pIVar12 = (tab_bar->Tabs).Data;
    iVar17 = (tab_bar->Tabs).Size;
    pIVar21 = pIVar12 + iVar17;
    pIVar21->ID = 0;
    pIVar21->Flags = 0;
    pIVar21->LastFrameVisible = -1;
    pIVar21->LastFrameSelected = -1;
    pIVar12[iVar17].NameOffset = -1;
    pIVar12[iVar17].Offset = 0.0;
    pIVar12[iVar17].Width = 0.0;
    pIVar12[iVar17].ContentWidth = 0.0;
    iVar17 = (tab_bar->Tabs).Size;
    uVar4 = iVar17 + 1;
    (tab_bar->Tabs).Size = uVar4;
    if (iVar17 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x50d,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar21 = (tab_bar->Tabs).Data;
    local_80 = pIVar21 + ((ulong)uVar4 - 1);
    local_80->ID = id;
    pIVar21[(ulong)uVar4 - 1].Width = fVar24;
  }
  pIVar21 = (tab_bar->Tabs).Data;
  local_40 = label;
  if ((local_80 < pIVar21) || (pIVar21 + (tab_bar->Tabs).Size <= local_80)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                  ,0x524,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)local_80 - (int)pIVar21) >> 5);
  local_80->ContentWidth = fVar24;
  local_74 = tab_bar->Flags;
  local_88 = CONCAT44(local_88._4_4_,tab_bar->PrevFrameVisible + 1);
  iVar17 = pIVar7->FrameCount;
  iVar22 = local_80->LastFrameVisible + 1;
  local_80->LastFrameVisible = iVar17;
  local_80->Flags = uVar15;
  iVar3 = (tab_bar->TabsNames).Buf.Size;
  iVar16 = iVar3 + -1;
  if (iVar3 == 0) {
    iVar16 = 0;
  }
  local_80->NameOffset = iVar16;
  sVar13 = strlen(label);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar13 + 1);
  if (iVar22 < iVar17) {
    if ((((tab_bar->Flags & 2U) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar17 <= (int)local_88 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((tab_bar->Flags & 1U) == 0) {
    fVar24 = tab_bar->OffsetNextTab;
    local_80->Offset = fVar24;
    tab_bar->OffsetNextTab = local_80->Width + (pIVar7->Style).ItemInnerSpacing.x + fVar24;
  }
  if (((uVar15 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar20 = (undefined7)((ulong)&tab_bar->TabsNames >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar19 = CONCAT71(uVar20,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_88 < iVar17) && ((tab_bar->Tabs).Size == 1)) {
    uVar19 = CONCAT71(uVar20,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar19 = 0;
  }
  if ((iVar22 < iVar17) &&
     ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0 || iVar17 <= (int)local_88)) {
    PushItemFlag(0x18,true);
LAB_00213356:
    local_98.Max.x = 0.0;
    local_98.Max.y = 0.0;
    local_98.Min.x = 0.0;
    local_98.Min.y = 0.0;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return SUB81(uVar19,0);
  }
  if (tab_bar->SelectedTabId == id) {
    local_80->LastFrameSelected = pIVar7->FrameCount;
  }
  fVar25 = (float)(int)(local_80->Offset - tab_bar->ScrollingAnim) + (tab_bar->BarRect).Min.x;
  fVar26 = (tab_bar->BarRect).Min.y + 0.0;
  local_48 = (this->DC).CursorPos;
  local_98.Max.x = fVar25 + local_80->Width;
  local_98.Min.y = fVar26;
  local_98.Min.x = fVar25;
  (this->DC).CursorPos = local_98.Min;
  local_98.Max.y = (float)local_58._4_4_ + fVar26;
  fVar24 = (tab_bar->BarRect).Min.x;
  bVar23 = true;
  if (fVar24 <= fVar25) {
    pIVar2 = &(tab_bar->BarRect).Max;
    bVar23 = pIVar2->x <= local_98.Max.x && local_98.Max.x != pIVar2->x;
  }
  local_58[0] = bVar23;
  local_88 = uVar19;
  local_5c = iVar17;
  if (bVar23 != false) {
    local_68.y = fVar26 + -1.0;
    local_68.x = (float)(~-(uint)(fVar24 <= fVar25) & (uint)fVar24 |
                        (uint)fVar25 & -(uint)(fVar24 <= fVar25));
    local_70.x = (tab_bar->BarRect).Max.x;
    local_70.y = local_98.Max.y;
    PushClipRect(&local_68,&local_70,true);
  }
  IVar6 = (this->DC).CursorMaxPos;
  local_68.y = local_98.Max.y - local_98.Min.y;
  local_68.x = local_98.Max.x - local_98.Min.x;
  ItemSize(&local_68,(pIVar7->Style).FramePadding.y);
  (this->DC).CursorMaxPos = IVar6;
  bVar23 = ItemAdd(&local_98,id,(ImRect *)0x0);
  if (!bVar23) {
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (this->DC).CursorPos = local_48;
    return (bool)(char)local_88;
  }
  bVar23 = ButtonBehavior(&local_98,id,(bool *)&local_68,(bool *)&local_70,
                          (uint)pIVar7->DragDropActive << 6 | 0x102);
  pbVar8 = local_38;
  if (bVar23) {
    tab_bar->NextSelectedTabId = id;
  }
  local_68.x._0_1_ = local_68.x._0_1_ | pIVar7->HoveredId == id;
  cVar5 = (char)local_88;
  if (local_70.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if ((((local_70.x._0_1_ == '\x01') && (local_5c <= iVar22)) &&
      (bVar23 = IsMouseDragging(0,-1.0), bVar23)) &&
     ((pIVar7->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar24 = (pIVar7->IO).MouseDelta.x;
    if ((0.0 <= fVar24) ||
       (pIVar2 = &(pIVar7->IO).MousePos, local_98.Min.x < pIVar2->x || local_98.Min.x == pIVar2->x))
    {
      if ((fVar24 <= 0.0) || ((pIVar7->IO).MousePos.x <= local_98.Max.x)) goto LAB_002135f8;
      IVar10 = '\x01';
    }
    else {
      IVar10 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x1a79,
                    "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                   );
    }
    tab_bar->ReorderRequestTabId = local_80->ID;
    tab_bar->ReorderRequestDir = IVar10;
  }
LAB_002135f8:
  draw_list = this->DrawList;
  idx = 0x22;
  if ((local_70.x._0_1_ == '\0') && (local_68.x._0_1_ == '\0')) {
    if (cVar5 == '\0') {
      idx = (uint)((local_74 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_74 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_98,flags_00,col);
  RenderNavHighlight(&local_98,id,1);
  bVar23 = IsItemHovered(8);
  if ((bVar23) &&
     ((bVar23 = IsMouseClicked(1,false), bVar23 || (bVar23 = IsMouseReleased(1), bVar23)))) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar4 = tab_bar->Flags;
  if (pbVar8 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)id + 1));
  }
  text = local_40;
  bVar23 = TabItemLabelAndCloseButton
                     (draw_list,&local_98,uVar4 >> 1 & 4 | uVar15,tab_bar->FramePadding,local_40,id,
                      close_button_id);
  if ((pbVar8 != (bool *)0x0) && (bVar23)) {
    *pbVar8 = false;
    if (tab_bar->VisibleTabId == local_80->ID) {
      if ((local_80->Flags & 1U) == 0) {
        local_80->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((local_80->Flags & 1U) != 0) {
      tab_bar->NextSelectedTabId = local_80->ID;
    }
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (this->DC).CursorPos = local_48;
  if (pIVar7->HoveredId != id) {
    return (bool)cVar5;
  }
  if (local_70.x._0_1_ != '\0') {
    return (bool)cVar5;
  }
  if (pIVar7->HoveredIdNotActiveTimer <= 0.5) {
    return (bool)cVar5;
  }
  bVar23 = IsItemHovered(0);
  if (!bVar23) {
    return (bool)cVar5;
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return (bool)cVar5;
  }
  pcVar14 = FindRenderedTextEnd(text,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar14 - (int)text),text);
  return (bool)cVar5;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}